

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_endian.h
# Opt level: O0

uint32_t archive_be32dec(void *pp)

{
  uint p0;
  uint p1;
  uint p2;
  uint p3;
  uchar *p;
  void *pp_local;
  
  return (uint)*pp << 0x18 | (uint)*(byte *)((long)pp + 1) << 0x10 |
         (uint)*(byte *)((long)pp + 2) << 8 | (uint)*(byte *)((long)pp + 3);
}

Assistant:

static inline uint32_t
archive_be32dec(const void *pp)
{
	unsigned char const *p = (unsigned char const *)pp;

	/* Store into unsigned temporaries before left shifting, to avoid
	promotion to signed int and then left shifting into the sign bit,
	which is undefined behaviour. */
	unsigned int p3 = p[3];
	unsigned int p2 = p[2];
	unsigned int p1 = p[1];
	unsigned int p0 = p[0];

	return ((p0 << 24) | (p1 << 16) | (p2 << 8) | p3);
}